

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_table_calculation.cpp
# Opt level: O1

void __thiscall
ParseTableCalculation::printItemSets
          (ParseTableCalculation *this,
          list<std::set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>,_std::allocator<std::set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>_>_>
          *item_sets)

{
  pointer pvVar1;
  long lVar2;
  int iVar3;
  ostream *poVar4;
  _Rb_tree_node_base *p_Var5;
  ulong uVar6;
  _List_node_base *p_Var7;
  long lVar8;
  int iVar9;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Item sets",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  p_Var7 = (item_sets->
           super__List_base<std::set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>,_std::allocator<std::set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var7 != (_List_node_base *)item_sets) {
    iVar9 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tState [",8);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]\n",2);
      for (p_Var5 = (_Rb_tree_node_base *)p_Var7[2]._M_prev;
          p_Var5 != (_Rb_tree_node_base *)&p_Var7[1]._M_prev;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t\t",2);
        pvVar1 = (this->rules_).
                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar3 = (int)((ulong)((long)*(pointer *)
                                     ((long)&pvVar1[(int)p_Var5[1]._M_color].
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data + 8) -
                             *(long *)&pvVar1[(int)p_Var5[1]._M_color].
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data) >> 5);
        if (0 < iVar3) {
          lVar8 = 8;
          uVar6 = 0;
          do {
            if (uVar6 == *(uint *)&p_Var5[1].field_0x4) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,".",1);
            }
            lVar2 = *(long *)&(this->rules_).
                              super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[(int)p_Var5[1]._M_color].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data;
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,*(char **)(lVar2 + -8 + lVar8),
                                *(long *)(lVar2 + lVar8));
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
            uVar6 = uVar6 + 1;
            pvVar1 = (this->rules_).
                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar3 = (int)((ulong)((long)*(pointer *)
                                         ((long)&pvVar1[(int)p_Var5[1]._M_color].
                                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_impl.super__Vector_impl_data + 8) -
                                 *(long *)&pvVar1[(int)p_Var5[1]._M_color].
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data) >> 5);
            lVar8 = lVar8 + 0x20;
          } while ((long)uVar6 < (long)iVar3);
        }
        if (*(int *)&p_Var5[1].field_0x4 == iVar3) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,".",1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," | ",3);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)p_Var5[1]._M_parent,
                            (long)p_Var5[1]._M_left);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
      std::ostream::put('\0');
      std::ostream::flush();
      iVar9 = iVar9 + 1;
      p_Var7 = (((_List_base<std::set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>,_std::allocator<std::set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>_>_>
                  *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var7 != (_List_node_base *)item_sets);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  return;
}

Assistant:

void ParseTableCalculation::printItemSets(const std::list<std::set<Item>>& item_sets)
{
	int i = 0;
	std::cout << "Item sets" << std::endl;
	for (auto& set : item_sets)
	{
		std::cout << "\tState [" << i << "]\n";
		for (const Item& item : set)
		{
			std::cout << "\t\t";
			for (int i = 0; i < static_cast<int>(rules_[item.ruleIndex].size()); ++i)
			{
				if (i == item.dotPosition)
				{
					std::cout << ".";
				}
				std::cout << rules_[item.ruleIndex][i] << " ";
			}
			if (item.dotPosition == static_cast<int>(rules_[item.ruleIndex].size()))
			{
				std::cout << ".";
			}
			std::cout << " | " << item.lookahead << std::endl;
		}
		std::cout << std::endl;
		++i;
	}
	std::cout << std::endl;
}